

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

int __thiscall QMetaMethod::parameterType(QMetaMethod *this,int index)

{
  long lVar1;
  int iVar2;
  undefined4 in_ESI;
  long in_FS_OFFSET;
  QMetaMethod *in_stack_00000018;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  parameterMetaType(in_stack_00000018,this._4_4_);
  iVar2 = QMetaType::id((QMetaType *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QMetaMethod::parameterType(int index) const
{
    return parameterMetaType(index).id();
}